

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

Status __thiscall cmsys::Directory::Load(Directory *this,string *name,string *errorMessage)

{
  int *piVar1;
  char *pcVar2;
  allocator<char> local_91;
  string local_90 [32];
  dirent *local_70;
  dirent *d;
  allocator<char> local_51;
  string local_50 [32];
  DIR *local_30;
  DIR *dir;
  string *errorMessage_local;
  string *name_local;
  Directory *this_local;
  
  dir = (DIR *)errorMessage;
  errorMessage_local = name;
  name_local = (string *)this;
  Clear(this);
  piVar1 = __errno_location();
  *piVar1 = 0;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_30 = opendir(pcVar2);
  if (local_30 == (DIR *)0x0) {
    if (dir != (DIR *)0x0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_50,pcVar2,&local_51);
      std::__cxx11::string::operator=((string *)dir,local_50);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    this_local = (Directory *)Status::POSIX_errno();
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    local_70 = readdir(local_30);
    while (local_70 != (dirent *)0x0) {
      std::
      vector<cmsys::DirectoryInternals::FileData,std::allocator<cmsys::DirectoryInternals::FileData>>
      ::emplace_back<char(&)[256]>
                ((vector<cmsys::DirectoryInternals::FileData,std::allocator<cmsys::DirectoryInternals::FileData>>
                  *)this->Internal,&local_70->d_name);
      local_70 = readdir(local_30);
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0) {
      std::__cxx11::string::operator=((string *)&this->Internal->Path,(string *)errorMessage_local);
      closedir(local_30);
      this_local = (Directory *)Status::Success();
    }
    else {
      if (dir != (DIR *)0x0) {
        piVar1 = __errno_location();
        pcVar2 = strerror(*piVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_90,pcVar2,&local_91);
        std::__cxx11::string::operator=((string *)dir,local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
      }
      this_local = (Directory *)Status::POSIX_errno();
    }
  }
  return (Status)this_local;
}

Assistant:

Status Directory::Load(std::string const& name, std::string* errorMessage)
{
  this->Clear();

  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  errno = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    this->Internal->Files.emplace_back(d->d_name);
  }
  if (errno != 0) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  this->Internal->Path = name;
  closedir(dir);
  return Status::Success();
}